

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode exchangeBuffer(void)

{
  UA_ByteString *pUVar1;
  UA_exchangeEncodeBuffer p_Var2;
  void *pvVar3;
  UA_StatusCode UVar4;
  
  pvVar3 = exchangeBufferCallbackHandle;
  p_Var2 = exchangeBufferCallback;
  pUVar1 = encodeBuf;
  if (exchangeBufferCallback == (UA_exchangeEncodeBuffer)0x0) {
    UVar4 = 0x80060000;
  }
  else {
    UVar4 = (*exchangeBufferCallback)
                      (exchangeBufferCallbackHandle,encodeBuf,(long)pos - (long)encodeBuf->data);
    pos = pUVar1->data;
    end = pos + pUVar1->length;
  }
  encodeBuf = pUVar1;
  exchangeBufferCallback = p_Var2;
  exchangeBufferCallbackHandle = pvVar3;
  return UVar4;
}

Assistant:

static UA_StatusCode
exchangeBuffer(void) {
    if(!exchangeBufferCallback)
        return UA_STATUSCODE_BADENCODINGERROR;

    /* Store context variables since chunk-sending might call UA_encode itself */
    UA_ByteString *store_encodeBuf = encodeBuf;
    UA_exchangeEncodeBuffer store_exchangeBufferCallback = exchangeBufferCallback;
    void *store_exchangeBufferCallbackHandle = exchangeBufferCallbackHandle;

    size_t offset = ((uintptr_t)pos - (uintptr_t)encodeBuf->data) / sizeof(UA_Byte);
    UA_StatusCode retval = exchangeBufferCallback(exchangeBufferCallbackHandle, encodeBuf, offset);

    /* Restore context variables. This restores the pointer to the buffer, not the buffer
     * itself. This is required so that a call to UA_encode can be made from within the
     * exchangeBufferCallback. For example to encode the chunk header */
    encodeBuf = store_encodeBuf;
    exchangeBufferCallback = store_exchangeBufferCallback;
    exchangeBufferCallbackHandle = store_exchangeBufferCallbackHandle;

    /* Set pos and end in order to continue encoding */
    pos = encodeBuf->data;
    end = &encodeBuf->data[encodeBuf->length];
    return retval;
}